

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall opengv::math::Sturm::Sturm(Sturm *this,MatrixXd *p)

{
  Index IVar1;
  Scalar *pSVar2;
  unsigned_long in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM1 [64];
  MatrixXd r;
  MatrixXd p2;
  MatrixXd *in_stack_00000118;
  MatrixXd *in_stack_00000120;
  MatrixXd *in_stack_00000128;
  Sturm *in_stack_00000130;
  MatrixXd p1;
  size_t i_1;
  size_t i;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe08;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffe10;
  Index in_stack_fffffffffffffe18;
  unsigned_long *in_stack_fffffffffffffe20;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  unsigned_long *in_stack_fffffffffffffe28;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffe30;
  unsigned_long blockCols;
  undefined8 *puVar4;
  Index in_stack_fffffffffffffe48;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe50;
  ulong local_90;
  ulong local_88;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38 [24];
  Index local_20;
  Index local_18;
  unsigned_long local_10;
  
  *in_RDI = &PTR__Sturm_014d5c58;
  puVar4 = in_RDI + 1;
  local_10 = in_RSI;
  local_18 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12ffb28);
  local_20 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12ffb3d);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            (in_stack_fffffffffffffe30,(long *)in_stack_fffffffffffffe28,
             (long *)in_stack_fffffffffffffe20);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x12ffb69);
  in_RDI[4] = IVar1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  this_00 = local_38;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe10,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe08);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12ffbb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (this_00,in_stack_fffffffffffffe18);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  blockCols = local_10;
  for (local_88 = 1; auVar3 = in_ZMM1._0_16_, local_88 < (ulong)in_RDI[4]; local_88 = local_88 + 1)
  {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x12ffc31);
    auVar3 = vcvtusi2sd_avx512f(auVar3,in_RDI[4] - local_88);
    in_ZMM1 = ZEXT1664(auVar3);
    in_stack_fffffffffffffe08 =
         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(*pSVar2 * auVar3._0_8_);
    in_stack_fffffffffffffe10 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x12ffc72);
    *(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)in_stack_fffffffffffffe10 =
         in_stack_fffffffffffffe08;
  }
  for (local_90 = 2; local_90 < (ulong)in_RDI[4]; local_90 = local_90 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(Index)in_RDI,
               (int)((ulong)puVar4 >> 0x20),blockCols);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe10,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               in_stack_fffffffffffffe08);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(Index)in_RDI,
               (int)((ulong)puVar4 >> 0x20),blockCols);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe10,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               in_stack_fffffffffffffe08);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x12ffd84)
    ;
    computeNegatedRemainder(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(Index)in_RDI,
               (int)((ulong)puVar4 >> 0x20),blockCols);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(Index)in_RDI,
               (int)((ulong)puVar4 >> 0x20),blockCols);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffe10,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffe08);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12ffe2f);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12ffe3c);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)0x12ffe49);
  }
  return;
}

Assistant:

opengv::math::Sturm::Sturm( const Eigen::MatrixXd & p ) :
    _C(Eigen::MatrixXd(p.cols(),p.cols()))
{
  _dimension = (size_t) _C.cols();
  _C = Eigen::MatrixXd(_dimension,_dimension);
  _C.row(0) = p;

  for( size_t i = 1; i < _dimension; i++ )
    _C(1,i) = _C(0,i-1) * (_dimension-i);

  for( size_t i = 2; i < _dimension; i++ )
  {
    Eigen::MatrixXd p1 = _C.block(i-2,i-2,1,_dimension-(i-2));
    Eigen::MatrixXd p2 = _C.block(i-1,i-1,1,_dimension-(i-1));
    Eigen::MatrixXd r;
    computeNegatedRemainder(p1,p2,r);
    _C.block(i,i,1,_dimension-i) = r.block(0,2,1,_dimension-i);
  }
}